

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

LargeRep * __thiscall
google::protobuf::internal::MicroString::AllocateOwnedRep
          (MicroString *this,size_t size,Arena *arena)

{
  undefined1 auVar2 [16];
  LargeRepKind v1;
  Nonnull<const_char_*> failure_msg;
  void *pvVar3;
  char *pcVar4;
  int line;
  size_t alloc_size;
  ulong size_00;
  LargeRep *this_00;
  SizedPtr SVar5;
  LargeRepKind local_34;
  LogMessageFatal local_30;
  undefined1 auVar1 [12];
  
  local_34 = kOwned;
  local_30.super_LogMessage._0_8_ = size;
  failure_msg = absl::lts_20250127::log_internal::
                Check_GEImpl<unsigned_long,google::protobuf::internal::MicroString::LargeRepKind>
                          ((unsigned_long *)&local_30,&local_34,"capacity >= kOwned");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    size_00 = size + 0x17 & 0xfffffffffffffff8;
    if (arena == (Arena *)0x0) {
      SVar5 = AllocateAtLeast(size_00);
      auVar1 = SVar5._0_12_;
    }
    else {
      pvVar3 = Arena::AllocateAligned(arena,size_00,8);
      auVar2._8_8_ = size_00;
      auVar2._0_8_ = pvVar3;
      auVar1 = auVar2._0_12_;
    }
    this_00 = auVar1._0_8_;
    this->rep_ = (void *)((ulong)this_00 | 1);
    this_00->capacity = auVar1._8_4_ - 0x10;
    pcVar4 = LargeRep::owned_head(this_00);
    this_00->payload = pcVar4;
    LargeRep::owned_head(this_00);
    this_00->size = (uint32_t)size;
    v1 = large_rep_kind(this);
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                            (v1,3,"+large_rep_kind() == +kOwned");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return this_00;
    }
    line = 0x90;
  }
  else {
    line = 0x7d;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

MicroString::LargeRep* MicroString::AllocateOwnedRep(size_t size,
                                                     Arena* arena) {
  size_t capacity = size;
  LargeRep* h;
  ABSL_DCHECK_GE(capacity, kOwned);
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(OwnedRepSize(capacity)));
    capacity = alloc.n - sizeof(LargeRep);
    h = reinterpret_cast<LargeRep*>(alloc.p);
  } else {
    size_t alloc_size = ArenaAlignDefault::Ceil(OwnedRepSize(capacity));
    capacity = alloc_size - sizeof(LargeRep);
    auto* alloc = arena->AllocateAligned(alloc_size);
    h = reinterpret_cast<LargeRep*>(alloc);
  }

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  h->capacity = capacity;
  h->payload = h->owned_head();
  h->SetInitialSize(size);

  ABSL_DCHECK_EQ(+large_rep_kind(), +kOwned);

  return h;
}